

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

void rtr_mgr_free(rtr_mgr_config *config)

{
  long lVar1;
  void *ptr;
  long in_FS_OFFSET;
  uint local_34;
  uint j;
  rtr_mgr_group_node *group_node;
  tommy_node *tmp;
  tommy_node *head;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR_MGR: %s()","rtr_mgr_free");
  pthread_rwlock_wrlock((pthread_rwlock_t *)&config->mutex);
  pfx_table_free(config->pfx_table);
  spki_table_free(config->spki_table);
  aspa_table_free(config->aspa_table,true);
  lrtr_free(config->spki_table);
  lrtr_free(config->pfx_table);
  tmp = tommy_list_head(&config->groups->list);
  while (tmp != (tommy_node *)0x0) {
    ptr = tmp->data;
    tmp = tmp->next;
    for (local_34 = 0; local_34 < *(uint *)(*(long *)((long)ptr + 0x20) + 8);
        local_34 = local_34 + 1) {
      tr_free((tr_socket *)**(undefined8 **)(**(long **)((long)ptr + 0x20) + (ulong)local_34 * 8));
    }
    lrtr_free(*(void **)((long)ptr + 0x20));
    lrtr_free(ptr);
  }
  lrtr_free(config->groups);
  pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
  pthread_rwlock_destroy((pthread_rwlock_t *)&config->mutex);
  lrtr_free(config);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT void rtr_mgr_free(struct rtr_mgr_config *config)
{
	MGR_DBG("%s()", __func__);
	pthread_rwlock_wrlock(&config->mutex);

	pfx_table_free(config->pfx_table);
	spki_table_free(config->spki_table);
	aspa_table_free(config->aspa_table, true);
	lrtr_free(config->spki_table);
	lrtr_free(config->pfx_table);

	/* Free linked list */
	tommy_node *head = tommy_list_head(&config->groups->list);

	while (head) {
		tommy_node *tmp = head;
		struct rtr_mgr_group_node *group_node = tmp->data;

		head = head->next;
		for (unsigned int j = 0; j < group_node->group->sockets_len; j++)
			tr_free(group_node->group->sockets[j]->tr_socket);

		lrtr_free(group_node->group);
		lrtr_free(group_node);
	}

	lrtr_free(config->groups);

	pthread_rwlock_unlock(&config->mutex);
	pthread_rwlock_destroy(&config->mutex);
	lrtr_free(config);
}